

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawtransaction_util.cpp
# Opt level: O0

void SignTransactionResultToJSON
               (CMutableTransaction *mtx,bool complete,
               map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
               *coins,map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
                      *input_errors,UniValue *result)

{
  bool bVar1;
  byte bVar2;
  undefined8 uVar3;
  reference txin;
  UniValue *this;
  vector<UniValue,_std::allocator<UniValue>_> *vec;
  byte in_SIL;
  UniValue *in_R8;
  long in_FS_OFFSET;
  pair<const_int,_bilingual_str> *err_pair;
  map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
  *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  UniValue vErrors;
  CTransaction *in_stack_fffffffffffffbd8;
  UniValue *in_stack_fffffffffffffbe0;
  UniValue *in_stack_fffffffffffffbe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbf0;
  UniValue *in_stack_fffffffffffffbf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc00;
  char *in_stack_fffffffffffffc08;
  UniValue *this_00;
  CTransaction *in_stack_fffffffffffffc10;
  undefined7 in_stack_fffffffffffffc18;
  undefined1 in_stack_fffffffffffffc1f;
  UniValue *in_stack_fffffffffffffc20;
  UniValue *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc28;
  int code;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  string *in_stack_fffffffffffffc48;
  UniValue *in_stack_fffffffffffffc50;
  allocator<char> local_325;
  undefined1 local_324;
  undefined1 local_323 [2];
  allocator<char> local_321;
  _Base_ptr local_320;
  _Base_ptr local_318;
  undefined1 local_309;
  UniValue local_308 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_309 = in_SIL & 1;
  std::__cxx11::string::string(in_stack_fffffffffffffbf0);
  UniValue::UniValue(in_stack_fffffffffffffbf8,(VType)((ulong)in_stack_fffffffffffffbf0 >> 0x20),
                     (string *)in_stack_fffffffffffffbe8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffbd8);
  local_318 = (_Base_ptr)
              std::
              map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
              ::begin((map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
                       *)in_stack_fffffffffffffbe0);
  local_320 = (_Base_ptr)
              std::
              map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
              ::end((map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
                     *)in_stack_fffffffffffffbe0);
  do {
    bVar1 = std::operator==((_Self *)in_stack_fffffffffffffbe8,(_Self *)in_stack_fffffffffffffbe0);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffc28,(char *)in_stack_fffffffffffffc20,
                 (allocator<char> *)CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18));
      CTransaction::CTransaction
                ((CTransaction *)CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18),
                 (CMutableTransaction *)in_stack_fffffffffffffc10);
      EncodeHexTx_abi_cxx11_(in_stack_fffffffffffffc10);
      UniValue::
      UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ((UniValue *)CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc10);
      UniValue::pushKV(in_stack_fffffffffffffc20,
                       (string *)CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18),
                       (UniValue *)in_stack_fffffffffffffc10);
      UniValue::~UniValue((UniValue *)in_stack_fffffffffffffbd8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffbd8);
      CTransaction::~CTransaction(in_stack_fffffffffffffbd8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffbd8);
      std::allocator<char>::~allocator(&local_321);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffc28,(char *)in_stack_fffffffffffffc20,
                 (allocator<char> *)CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18));
      UniValue::UniValue<bool_&,_bool,_true>
                ((UniValue *)CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18),
                 (bool *)in_stack_fffffffffffffc10);
      UniValue::pushKV(in_stack_fffffffffffffc20,
                       (string *)CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18),
                       (UniValue *)in_stack_fffffffffffffc10);
      UniValue::~UniValue((UniValue *)in_stack_fffffffffffffbd8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffbd8);
      std::allocator<char>::~allocator((allocator<char> *)(local_323 + 1));
      bVar1 = UniValue::empty((UniValue *)in_stack_fffffffffffffbd8);
      if (!bVar1) {
        this_02 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_323;
        this_01 = in_R8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (this_02,(char *)this_01,
                   (allocator<char> *)CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18))
        ;
        bVar2 = UniValue::exists(in_stack_fffffffffffffbe0,(string *)in_stack_fffffffffffffbd8);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffbd8);
        std::allocator<char>::~allocator((allocator<char> *)local_323);
        if ((bVar2 & 1) != 0) {
          in_stack_fffffffffffffc10 = (CTransaction *)&local_324;
          this_00 = in_R8;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (this_02,(char *)this_01,
                     (allocator<char> *)CONCAT17(bVar2,in_stack_fffffffffffffc18));
          this = UniValue::operator[](in_stack_fffffffffffffbe8,(string *)in_stack_fffffffffffffbe0)
          ;
          vec = UniValue::getValues(this_00);
          UniValue::push_backV(this,vec);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffbd8);
          std::allocator<char>::~allocator((allocator<char> *)&local_324);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (this_02,(char *)this_01,
                   (allocator<char> *)CONCAT17(bVar2,in_stack_fffffffffffffc18));
        UniValue::UniValue(in_R8,local_308);
        UniValue::pushKV(this_01,(string *)CONCAT17(bVar2,in_stack_fffffffffffffc18),
                         (UniValue *)in_stack_fffffffffffffc10);
        UniValue::~UniValue((UniValue *)in_stack_fffffffffffffbd8);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffbd8);
        std::allocator<char>::~allocator(&local_325);
      }
      UniValue::~UniValue((UniValue *)in_stack_fffffffffffffbd8);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return;
      }
LAB_019a8f30:
      __stack_chk_fail();
    }
    std::_Rb_tree_const_iterator<std::pair<const_int,_bilingual_str>_>::operator*
              ((_Rb_tree_const_iterator<std::pair<const_int,_bilingual_str>_> *)
               in_stack_fffffffffffffbd8);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffbe8,(char *)in_stack_fffffffffffffbe0);
    if (bVar1) {
      uVar3 = __cxa_allocate_exception(0x58);
      code = (int)((ulong)in_stack_fffffffffffffc28 >> 0x20);
      std::vector<CTxIn,_std::allocator<CTxIn>_>::at
                ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffffbe8,
                 (size_type)in_stack_fffffffffffffbe0);
      std::
      map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
      ::at((map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
            *)in_stack_fffffffffffffc00,(key_type *)in_stack_fffffffffffffbf8);
      CTxOut::ToString_abi_cxx11_((CTxOut *)in_stack_fffffffffffffc10);
      tinyformat::format<std::__cxx11::string>(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
      JSONRPCError(code,(string *)CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18));
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(uVar3,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_019a8f30;
    }
    txin = std::vector<CTxIn,_std::allocator<CTxIn>_>::at
                     ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffffbe8,
                      (size_type)in_stack_fffffffffffffbe0);
    TxInErrorToJSON(txin,in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    std::_Rb_tree_const_iterator<std::pair<const_int,_bilingual_str>_>::operator++
              ((_Rb_tree_const_iterator<std::pair<const_int,_bilingual_str>_> *)
               in_stack_fffffffffffffbd8);
  } while( true );
}

Assistant:

void SignTransactionResultToJSON(CMutableTransaction& mtx, bool complete, const std::map<COutPoint, Coin>& coins, const std::map<int, bilingual_str>& input_errors, UniValue& result)
{
    // Make errors UniValue
    UniValue vErrors(UniValue::VARR);
    for (const auto& err_pair : input_errors) {
        if (err_pair.second.original == "Missing amount") {
            // This particular error needs to be an exception for some reason
            throw JSONRPCError(RPC_TYPE_ERROR, strprintf("Missing amount for %s", coins.at(mtx.vin.at(err_pair.first).prevout).out.ToString()));
        }
        TxInErrorToJSON(mtx.vin.at(err_pair.first), vErrors, err_pair.second.original);
    }

    result.pushKV("hex", EncodeHexTx(CTransaction(mtx)));
    result.pushKV("complete", complete);
    if (!vErrors.empty()) {
        if (result.exists("errors")) {
            vErrors.push_backV(result["errors"].getValues());
        }
        result.pushKV("errors", std::move(vErrors));
    }
}